

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_window_set_focus(nk_context *ctx,char *name)

{
  long lVar1;
  nk_hash hash;
  nk_window *win;
  long lVar2;
  
  if (ctx != (nk_context *)0x0) {
    lVar2 = 0;
    if ((name != (char *)0x0) && (*name != '\0')) {
      lVar2 = 0;
      do {
        lVar1 = lVar2 + 1;
        lVar2 = lVar2 + 1;
      } while (name[lVar1] != '\0');
    }
    hash = nk_murmur_hash(name,(int)lVar2,0x40);
    win = nk_find_window(ctx,hash,name);
    if ((win != (nk_window *)0x0) && (ctx->end != win)) {
      nk_remove_window(ctx,win);
      nk_insert_window(ctx,win,NK_INSERT_BACK);
    }
    ctx->active = win;
  }
  return;
}

Assistant:

NK_API void
nk_window_set_focus(struct nk_context *ctx, const char *name)
{
int title_len;
nk_hash title_hash;
struct nk_window *win;
NK_ASSERT(ctx);
if (!ctx) return;

title_len = (int)nk_strlen(name);
title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
win = nk_find_window(ctx, title_hash, name);
if (win && ctx->end != win) {
nk_remove_window(ctx, win);
nk_insert_window(ctx, win, NK_INSERT_BACK);
}
ctx->active = win;
}